

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

uint32_t find_firstassertedcu(PCRE2_SPTR16 code,int32_t *flags,uint32_t inassert)

{
  bool local_43;
  PCRE2_UCHAR16 *pPStack_40;
  PCRE2_UCHAR16 op;
  PCRE2_SPTR16 scode;
  int xl;
  int dflags;
  uint32_t d;
  int cflags;
  uint32_t c;
  uint32_t inassert_local;
  int32_t *flags_local;
  PCRE2_SPTR16 code_local;
  
  d = 0;
  dflags = -1;
  *flags = -1;
  cflags = inassert;
  _c = flags;
  flags_local = (int32_t *)code;
  do {
    local_43 = true;
    if ((((short)*flags_local != 0x85) && (local_43 = true, (short)*flags_local != 0x8a)) &&
       (local_43 = true, (short)*flags_local != 0x86)) {
      local_43 = (short)*flags_local == 0x8b;
    }
    scode._0_4_ = (uint)local_43;
    pPStack_40 = first_significant_code
                           ((PCRE2_SPTR16)((long)flags_local + (long)(int)(uint)scode * 2 + 4),1);
    switch(*pPStack_40) {
    default:
      return 0;
    case 0x29:
      pPStack_40 = pPStack_40 + 1;
    case 0x1d:
    case 0x23:
    case 0x24:
    case 0x2b:
      if (cflags == 0) {
        return 0;
      }
      if (dflags < 0) {
        d = (uint32_t)pPStack_40[1];
        dflags = 0;
      }
      else if (d != pPStack_40[1]) {
        return 0;
      }
      break;
    case 0x36:
      pPStack_40 = pPStack_40 + 1;
    case 0x1e:
    case 0x30:
    case 0x31:
    case 0x38:
      if (cflags == 0) {
        return 0;
      }
      if (dflags < 0) {
        d = (uint32_t)pPStack_40[1];
        dflags = 1;
      }
      else if (d != pPStack_40[1]) {
        return 0;
      }
      break;
    case 0x7e:
    case 0x82:
    case 0x83:
    case 0x84:
    case 0x85:
    case 0x86:
    case 0x8a:
    case 0x8b:
      xl = find_firstassertedcu
                     (pPStack_40,(int32_t *)((long)&scode + 4),cflags + (uint)(*pPStack_40 == 0x7e))
      ;
      if (scode._4_4_ < 0) {
        return 0;
      }
      if (dflags < 0) {
        dflags = scode._4_4_;
        d = xl;
      }
      else if ((d != xl) || (dflags != scode._4_4_)) {
        return 0;
      }
    }
    flags_local = (int32_t *)
                  ((long)flags_local + (long)(int)(uint)*(ushort *)((long)flags_local + 2) * 2);
    if ((short)*flags_local != 0x78) {
      *_c = dflags;
      return d;
    }
  } while( true );
}

Assistant:

static uint32_t
find_firstassertedcu(PCRE2_SPTR code, int32_t *flags, uint32_t inassert)
{
uint32_t c = 0;
int cflags = REQ_NONE;

*flags = REQ_NONE;
do {
   uint32_t d;
   int dflags;
   int xl = (*code == OP_CBRA || *code == OP_SCBRA ||
             *code == OP_CBRAPOS || *code == OP_SCBRAPOS)? IMM2_SIZE:0;
   PCRE2_SPTR scode = first_significant_code(code + 1+LINK_SIZE + xl, TRUE);
   PCRE2_UCHAR op = *scode;

   switch(op)
     {
     default:
     return 0;

     case OP_BRA:
     case OP_BRAPOS:
     case OP_CBRA:
     case OP_SCBRA:
     case OP_CBRAPOS:
     case OP_SCBRAPOS:
     case OP_ASSERT:
     case OP_ONCE:
     d = find_firstassertedcu(scode, &dflags, inassert + ((op==OP_ASSERT)?1:0));
     if (dflags < 0)
       return 0;
     if (cflags < 0) { c = d; cflags = dflags; }
       else if (c != d || cflags != dflags) return 0;
     break;

     case OP_EXACT:
     scode += IMM2_SIZE;
     /* Fall through */

     case OP_CHAR:
     case OP_PLUS:
     case OP_MINPLUS:
     case OP_POSPLUS:
     if (inassert == 0) return 0;
     if (cflags < 0) { c = scode[1]; cflags = 0; }
       else if (c != scode[1]) return 0;
     break;

     case OP_EXACTI:
     scode += IMM2_SIZE;
     /* Fall through */

     case OP_CHARI:
     case OP_PLUSI:
     case OP_MINPLUSI:
     case OP_POSPLUSI:
     if (inassert == 0) return 0;
     if (cflags < 0) { c = scode[1]; cflags = REQ_CASELESS; }
       else if (c != scode[1]) return 0;
     break;
     }

   code += GET(code, 1);
   }
while (*code == OP_ALT);

*flags = cflags;
return c;
}